

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O1

void Imf_2_5::wav2Encode(unsigned_short *in,int nx,int ox,int ny,int oy,unsigned_short mx)

{
  ushort *puVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  short bs_1;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ushort *puVar17;
  ushort *puVar18;
  uint uVar19;
  
  iVar3 = ny;
  if (nx < ny) {
    iVar3 = nx;
  }
  if (1 < iVar3) {
    uVar16 = 1;
    uVar8 = 2;
    do {
      iVar4 = (ny - uVar8) * oy;
      iVar6 = uVar16 * ox;
      puVar18 = in;
      if (-1 < iVar4) {
        iVar7 = uVar16 * oy;
        iVar9 = (nx - uVar8) * ox;
        do {
          puVar17 = puVar18;
          if (-1 < iVar9) {
            do {
              puVar1 = puVar17 + iVar7;
              uVar5 = (uint)(short)*puVar17;
              uVar2 = puVar17[iVar6];
              if (mx < 0x4000) {
                iVar14 = uVar5 - (int)(short)uVar2;
                iVar11 = (int)(short)*puVar1 - (int)(short)puVar1[iVar6];
                uVar5 = (int)(short)uVar2 + uVar5;
                uVar12 = (int)(short)puVar1[iVar6] + (int)(short)*puVar1;
                *puVar17 = (ushort)((uint)(((int)uVar12 >> 1) + ((int)uVar5 >> 1)) >> 1);
                *puVar1 = (short)(uVar5 >> 1) - (short)(uVar12 >> 1);
                iVar15 = iVar14 - iVar11;
                puVar17[iVar6] = (ushort)((uint)((int)(short)iVar11 + (int)(short)iVar14) >> 1);
              }
              else {
                uVar5 = (uVar5 ^ 0x8000) & 0xffff;
                uVar12 = uVar5 - uVar2;
                uVar19 = (*puVar1 ^ 0x8000) - (uint)puVar1[iVar6];
                uVar13 = uVar19 >> 0x10 & 0x8000 ^ (uint)puVar1[iVar6] + (*puVar1 ^ 0x8000) >> 1;
                uVar5 = uVar5 + uVar2 >> 1 ^ 0x8000 ^ uVar12 >> 0x10 & 0x8000;
                iVar15 = uVar5 - uVar13;
                *puVar17 = (ushort)((uint)iVar15 >> 0x10) & 0x8000 ^ (ushort)(uVar13 + uVar5 >> 1);
                *puVar1 = (ushort)iVar15;
                uVar5 = uVar12 & 0xffff ^ 0x8000;
                uVar19 = uVar19 & 0xffff;
                iVar15 = uVar5 - uVar19;
                puVar17[iVar6] =
                     (ushort)((uint)iVar15 >> 0x10) & 0x8000 ^ (ushort)(uVar5 + uVar19 >> 1);
              }
              puVar1[iVar6] = (ushort)iVar15;
              puVar17 = puVar17 + (int)(uVar8 * ox);
            } while (puVar17 <= puVar18 + iVar9);
          }
          if ((nx & uVar16) != 0) {
            uVar5 = (uint)(short)*puVar17;
            uVar2 = puVar17[iVar7];
            if (mx < 0x4000) {
              uVar10 = (ushort)((int)(short)uVar2 + uVar5 >> 1);
              iVar15 = uVar5 - (int)(short)uVar2;
            }
            else {
              uVar5 = (uVar5 ^ 0x8000) & 0xffff;
              iVar15 = uVar5 - uVar2;
              uVar10 = (ushort)((uint)iVar15 >> 0x10) & 0x8000 ^ (ushort)(uVar5 + uVar2 >> 1);
            }
            puVar17[iVar7] = (ushort)iVar15;
            *puVar17 = uVar10;
          }
          puVar18 = puVar18 + (int)(uVar8 * oy);
        } while (puVar18 <= in + iVar4);
      }
      if (((uVar16 & ny) != 0) && (iVar4 = (nx - uVar8) * ox, -1 < iVar4)) {
        puVar17 = puVar18 + iVar4;
        do {
          uVar16 = (uint)(short)*puVar18;
          uVar2 = puVar18[iVar6];
          if (mx < 0x4000) {
            uVar10 = (ushort)((int)(short)uVar2 + uVar16 >> 1);
            iVar4 = uVar16 - (int)(short)uVar2;
          }
          else {
            uVar16 = (uVar16 ^ 0x8000) & 0xffff;
            iVar4 = uVar16 - uVar2;
            uVar10 = (ushort)((uint)iVar4 >> 0x10) & 0x8000 ^ (ushort)(uVar16 + uVar2 >> 1);
          }
          puVar18[iVar6] = (ushort)iVar4;
          *puVar18 = uVar10;
          puVar18 = puVar18 + (int)(uVar8 * ox);
        } while (puVar18 <= puVar17);
      }
      uVar5 = uVar8 * 2;
      uVar16 = uVar8;
      uVar8 = uVar5;
    } while ((int)uVar5 <= iVar3);
  }
  return;
}

Assistant:

void
wav2Encode
    (unsigned short*	in,	// io: values are transformed in place
     int		nx,	// i : x size
     int		ox,	// i : x offset
     int		ny,	// i : y size
     int		oy,	// i : y offset
     unsigned short	mx)	// i : maximum in[x][y] value
{
    bool w14 = (mx < (1 << 14));
    int	n  = (nx > ny)? ny: nx;
    int	p  = 1;			// == 1 <<  level
    int p2 = 2;			// == 1 << (level+1)

    //
    // Hierachical loop on smaller dimension n
    //

    while (p2 <= n)
    {
	unsigned short *py = in;
	unsigned short *ey = in + oy * (ny - p2);
	int oy1 = oy * p;
	int oy2 = oy * p2;
	int ox1 = ox * p;
	int ox2 = ox * p2;
	unsigned short i00,i01,i10,i11;

	//
	// Y loop
	//

	for (; py <= ey; py += oy2)
	{
	    unsigned short *px = py;
	    unsigned short *ex = py + ox * (nx - p2);

	    //
	    // X loop
	    //

	    for (; px <= ex; px += ox2)
	    {
		unsigned short *p01 = px  + ox1;
		unsigned short *p10 = px  + oy1;
		unsigned short *p11 = p10 + ox1;

		//
		// 2D wavelet encoding
		//

		if (w14)
		{
		    wenc14 (*px,  *p01, i00, i01);
		    wenc14 (*p10, *p11, i10, i11);
		    wenc14 (i00, i10, *px,  *p10);
		    wenc14 (i01, i11, *p01, *p11);
		}
		else
		{
		    wenc16 (*px,  *p01, i00, i01);
		    wenc16 (*p10, *p11, i10, i11);
		    wenc16 (i00, i10, *px,  *p10);
		    wenc16 (i01, i11, *p01, *p11);
		}
	    }

	    //
	    // Encode (1D) odd column (still in Y loop)
	    //

	    if (nx & p)
	    {
		unsigned short *p10 = px + oy1;

		if (w14)
		    wenc14 (*px, *p10, i00, *p10);
		else
		    wenc16 (*px, *p10, i00, *p10);

		*px= i00;
	    }
	}

	//
	// Encode (1D) odd line (must loop in X)
	//

	if (ny & p)
	{
	    unsigned short *px = py;
	    unsigned short *ex = py + ox * (nx - p2);

	    for (; px <= ex; px += ox2)
	    {
		unsigned short *p01 = px + ox1;

		if (w14)
		    wenc14 (*px, *p01, i00, *p01);
		else
		    wenc16 (*px, *p01, i00, *p01);

		*px= i00;
	    }
	}

	//
	// Next level
	//

	p = p2;
	p2 <<= 1;
    }
}